

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ConversionError::~ConversionError(ConversionError *this)

{
  ConversionError *this_local;
  
  ~ConversionError(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + " is not an allowed value for " + name) {}